

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QRect * __thiscall
QAbstractItemViewPrivate::renderToPixmap
          (QAbstractItemViewPrivate *this,QModelIndexList *indexes,QRect *r)

{
  bool bVar1;
  QAbstractItemView *pQVar2;
  QWindow *pQVar3;
  QStyleOptionViewItem *this_00;
  qsizetype qVar4;
  const_reference pQVar5;
  long *plVar6;
  undefined8 in_RCX;
  undefined8 in_RDX;
  QAbstractItemViewPrivate *in_RSI;
  QRect *in_RDI;
  long in_FS_OFFSET;
  QRect *c;
  QRect QVar7;
  QModelIndex *current;
  int j;
  qreal scale;
  QWindow *window;
  QAbstractItemView *q;
  QPixmap *pixmap;
  QPainter painter;
  QItemViewPaintPairs paintPairs;
  QStyleOptionViewItem option;
  const_reference in_stack_fffffffffffffe48;
  QRect *this_01;
  QWidgetPrivate *in_stack_fffffffffffffe78;
  QModelIndex *pQVar8;
  int iVar9;
  uint in_stack_fffffffffffffe84;
  uint uVar10;
  QRect *this_02;
  undefined8 local_128;
  undefined8 local_120;
  undefined1 *local_118;
  QSize local_110;
  QSize local_108;
  QList<QItemViewPaintPair> local_100;
  undefined1 local_e8 [8];
  QFlags<QStyle::StateFlag> aQStack_e0 [2];
  undefined8 local_d8;
  undefined8 local_d0;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  pQVar2 = q_func(in_RSI);
  local_100.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_100.d.ptr = (QItemViewPaintPair *)&DAT_aaaaaaaaaaaaaaaa;
  local_100.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(*(long *)&(in_RSI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate + 0x128))(&local_100,in_RSI,in_RDX,in_RCX);
  bVar1 = QList<QItemViewPaintPair>::isEmpty((QList<QItemViewPaintPair> *)0x80fa0b);
  if (bVar1) {
    QPixmap::QPixmap((QPixmap *)this_01);
  }
  else {
    pQVar3 = QWidgetPrivate::windowHandle
                       (in_stack_fffffffffffffe78,(WindowHandleMode)((ulong)in_RSI >> 0x20));
    if (pQVar3 == (QWindow *)0x0) {
      c = (QRect *)0x3ff0000000000000;
    }
    else {
      c = (QRect *)QWindow::devicePixelRatio();
    }
    in_stack_fffffffffffffe84 = in_stack_fffffffffffffe84 & 0xffffff;
    *(undefined1 **)this_01 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&this_01->x2 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)(this_01 + 1) = &DAT_aaaaaaaaaaaaaaaa;
    this_02 = c;
    local_110 = QRect::size(this_01);
    local_108 = ::operator*((QSize *)this_01,(qreal)c);
    QPixmap::QPixmap((QPixmap *)this_01,(QSize *)&local_108);
    QPixmap::setDevicePixelRatio((double)this_02);
    QColor::QColor(&local_18,transparent);
    QPixmap::fill((QColor *)this_01);
    local_118 = &DAT_aaaaaaaaaaaaaaaa;
    QPainter::QPainter((QPainter *)&local_118,(QPaintDevice *)this_01);
    memset(local_e8,0xaa,0xd0);
    QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x80fb54);
    (**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.super_QWidget + 0x2f8))
              (pQVar2,local_e8);
    QFlags<QStyle::StateFlag>::operator|=(aQStack_e0,State_Selected);
    iVar9 = 0;
    while( true ) {
      this_00 = (QStyleOptionViewItem *)(long)iVar9;
      qVar4 = QList<QItemViewPaintPair>::size(&local_100);
      if (qVar4 <= (long)this_00) break;
      in_stack_fffffffffffffe48 =
           QList<QItemViewPaintPair>::at
                     ((QList<QItemViewPaintPair> *)this_00,(qsizetype)in_stack_fffffffffffffe48);
      QRect::topLeft(&in_stack_fffffffffffffe48->rect);
      ::operator-((QPoint *)this_00);
      QVar7 = QRect::translated(this_02,(QPoint *)CONCAT44(in_stack_fffffffffffffe84,iVar9));
      local_128 = QVar7._0_8_;
      local_d8 = local_128;
      local_120 = QVar7._8_8_;
      local_d0 = local_120;
      pQVar5 = QList<QItemViewPaintPair>::at
                         ((QList<QItemViewPaintPair> *)this_00,(qsizetype)in_stack_fffffffffffffe48)
      ;
      pQVar8 = &pQVar5->index;
      (**(code **)(*(long *)&(in_RSI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                             super_QWidgetPrivate + 0x130))(in_RSI,local_e8,pQVar8);
      plVar6 = (long *)(**(code **)(*(long *)&(pQVar2->super_QAbstractScrollArea).super_QFrame.
                                              super_QWidget + 0x208))(pQVar2,pQVar8);
      (**(code **)(*plVar6 + 0x60))(plVar6,&local_118,local_e8,pQVar8);
      iVar9 = iVar9 + 1;
    }
    uVar10 = 0x1000000;
    QStyleOptionViewItem::~QStyleOptionViewItem(this_00);
    QPainter::~QPainter((QPainter *)&local_118);
    if ((uVar10 & 0x1000000) == 0) {
      QPixmap::~QPixmap((QPixmap *)this_01);
    }
  }
  QList<QItemViewPaintPair>::~QList((QList<QItemViewPaintPair> *)0x80fcfb);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QPixmap QAbstractItemViewPrivate::renderToPixmap(const QModelIndexList &indexes, QRect *r) const
{
    Q_Q(const QAbstractItemView);
    Q_ASSERT(r);
    QItemViewPaintPairs paintPairs = draggablePaintPairs(indexes, r);
    if (paintPairs.isEmpty())
        return QPixmap();

    QWindow *window = windowHandle(WindowHandleMode::Closest);
    const qreal scale = window ? window->devicePixelRatio() : qreal(1);

    QPixmap pixmap(r->size() * scale);
    pixmap.setDevicePixelRatio(scale);

    pixmap.fill(Qt::transparent);
    QPainter painter(&pixmap);
    QStyleOptionViewItem option;
    q->initViewItemOption(&option);
    option.state |= QStyle::State_Selected;
    for (int j = 0; j < paintPairs.size(); ++j) {
        option.rect = paintPairs.at(j).rect.translated(-r->topLeft());
        const QModelIndex &current = paintPairs.at(j).index;
        adjustViewOptionsForIndex(&option, current);
        q->itemDelegateForIndex(current)->paint(&painter, option, current);
    }
    return pixmap;
}